

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void __thiscall sznet::net::TcpClient::removeConnection(TcpClient *this,TcpConnectionPtr *conn)

{
  EventLoop *pEVar1;
  bool bVar2;
  LogLevel LVar3;
  element_type *this_00;
  EventLoop *pEVar4;
  LogStream *this_01;
  self *psVar5;
  element_type *peVar6;
  SourceFile file;
  InetAddress local_1080;
  undefined1 local_1060 [12];
  Logger local_1050;
  code *local_70;
  undefined8 local_68;
  type local_60;
  Functor local_40;
  MutexLockGuard local_20;
  MutexLockGuard lock;
  TcpConnectionPtr *conn_local;
  TcpClient *this_local;
  
  lock.m_mutex = (MutexLock *)conn;
  EventLoop::assertInLoopThread(this->m_loop);
  pEVar1 = this->m_loop;
  this_00 = std::
            __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)lock.m_mutex);
  pEVar4 = TcpConnection::getLoop(this_00);
  if (pEVar1 != pEVar4) {
    __assert_fail("m_loop == conn->getLoop()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                  ,0x99,"void sznet::net::TcpClient::removeConnection(const TcpConnectionPtr &)");
  }
  MutexLockGuard::MutexLockGuard(&local_20,&this->m_mutex);
  bVar2 = std::operator==(&this->m_connection,(shared_ptr<sznet::net::TcpConnection> *)lock.m_mutex)
  ;
  if (!bVar2) {
    __assert_fail("m_connection == conn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                  ,0x9d,"void sznet::net::TcpClient::removeConnection(const TcpConnectionPtr &)");
  }
  std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->m_connection).
              super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  MutexLockGuard::~MutexLockGuard(&local_20);
  pEVar1 = this->m_loop;
  local_70 = TcpConnection::connectDestroyed;
  local_68 = 0;
  std::bind<void(sznet::net::TcpConnection::*)(),std::shared_ptr<sznet::net::TcpConnection>const&>
            (&local_60,(offset_in_TcpConnection_to_subr *)&local_70,
             (shared_ptr<sznet::net::TcpConnection> *)lock.m_mutex);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
            ((function<void()> *)&local_40,&local_60);
  EventLoop::queueInLoop(pEVar1,&local_40);
  std::function<void_()>::~function(&local_40);
  std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>::
  ~_Bind(&local_60);
  if (((this->m_retry & 1U) != 0) && ((this->m_connect & 1U) != 0)) {
    LVar3 = Logger::logLevel();
    if ((int)LVar3 < 3) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_1060,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_1060._0_8_;
      file.m_size = local_1060._8_4_;
      Logger::Logger(&local_1050,file,0xa4);
      this_01 = Logger::stream(&local_1050);
      psVar5 = LogStream::operator<<(this_01,"TcpClient::connect[");
      psVar5 = LogStream::operator<<(psVar5,&this->m_name);
      psVar5 = LogStream::operator<<(psVar5,"] - Reconnecting to ");
      peVar6 = std::
               __shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_connector);
      Connector::serverAddress(peVar6);
      InetAddress::toIpPort_abi_cxx11_(&local_1080);
      LogStream::operator<<(psVar5,(string *)&local_1080);
      std::__cxx11::string::~string((string *)&local_1080);
      Logger::~Logger(&local_1050);
    }
    peVar6 = std::
             __shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_connector);
    Connector::restart(peVar6);
  }
  return;
}

Assistant:

void TcpClient::removeConnection(const TcpConnectionPtr& conn)
{
	m_loop->assertInLoopThread();
	assert(m_loop == conn->getLoop());

	{
		MutexLockGuard lock(m_mutex);
		assert(m_connection == conn);
		m_connection.reset();
	}

	m_loop->queueInLoop(std::bind(&TcpConnection::connectDestroyed, conn));
	if (m_retry && m_connect)
	{
		LOG_INFO << "TcpClient::connect[" << m_name << "] - Reconnecting to "
				 << m_connector->serverAddress().toIpPort();
		m_connector->restart();
	}
}